

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O1

void vrna_params_prepare(vrna_fold_compound_t *fc,uint options)

{
  int iVar1;
  vrna_exp_param_t *pvVar2;
  vrna_md_t *md;
  
  if ((fc != (vrna_fold_compound_t *)0x0) && ((options & 2) != 0)) {
    md = &fc->params->model_details;
    pvVar2 = fc->exp_params;
    if ((pvVar2 != (vrna_exp_param_t *)0x0) &&
       (iVar1 = bcmp(md,&pvVar2->model_details,0x7e8), iVar1 != 0)) {
      free(pvVar2);
      fc->exp_params = (vrna_exp_param_t *)0x0;
    }
    if (fc->exp_params == (vrna_exp_param_t *)0x0) {
      if (fc->type == VRNA_FC_TYPE_SINGLE) {
        pvVar2 = get_scaled_exp_params(md,-1.0);
      }
      else {
        pvVar2 = get_exp_params_ali(md,(fc->field_23).field_1.n_seq,-1.0);
      }
      fc->exp_params = pvVar2;
    }
  }
  return;
}

Assistant:

PUBLIC void
vrna_params_prepare(vrna_fold_compound_t  *fc,
                    unsigned int          options)
{
  if (fc) {
    vrna_md_t *md_p;

    /*
     *  every vrna_fold_compound_t must have a vrna_paramt_t structure attached
     *  to it that holds the current model details. So we just use this here as
     *  the reference model
     */
    md_p = &(fc->params->model_details);

    if (options & VRNA_OPTION_PF) {
      /* remove previous parameters if present and they differ from reference model */
      if (fc->exp_params) {
        if (memcmp(md_p, &(fc->exp_params->model_details), sizeof(vrna_md_t)) != 0) {
          free(fc->exp_params);
          fc->exp_params = NULL;
        }
      }

      if (!fc->exp_params)
        fc->exp_params = (fc->type == VRNA_FC_TYPE_SINGLE) ? \
                         vrna_exp_params(md_p) : \
                         vrna_exp_params_comparative(fc->n_seq, md_p);
    }
  }
}